

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::emit_specialization_constants_and_structs(CompilerHLSL *this)

{
  uint uVar1;
  Types TVar2;
  size_t sVar3;
  TypedID<(spirv_cross::Types)0> *pTVar4;
  Variant *pVVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint32_t id;
  SPIRVariable *var;
  SPIRType *pSVar9;
  SPIRConstant *pSVar10;
  SPIRUndef *pSVar11;
  size_type sVar12;
  SPIRConstantOp *pSVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  string *ts_1_00;
  long lVar14;
  bool bVar15;
  LoopLock loop_lock_1;
  string name;
  LoopLock loop_lock;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)1>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>_>
  io_block_types;
  string local_110;
  string local_f0;
  uint32_t local_cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ParsedIR *local_a8;
  LoopLock local_a0;
  ulong local_98;
  long local_90;
  TypedID<(spirv_cross::Types)0> *local_88;
  SpecializationConstant local_80;
  SpecializationConstant local_78;
  SpecializationConstant local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_70.id.id = 0;
  local_78.id.id = 0;
  local_80.id.id = 0;
  local_cc = Compiler::get_work_group_size_specialization_constants
                       ((Compiler *)this,&local_70,&local_78,&local_80);
  local_68._M_allocated_capacity = (size_type)&uStack_38;
  local_68._8_8_ = 1;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0x3f800000;
  local_40 = 0;
  uStack_38 = 0;
  local_a8 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_a8);
  sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar3 != 0) {
    pTVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar14 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar4->id + lVar14);
      pVVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[uVar1].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + uVar1);
        pSVar9 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(var->super_IVariant).field_0xc);
        if (((((var->storage | StorageClassUniform) == StorageClassOutput) &&
             (var->remapped_variable == false)) && (pSVar9->pointer == true)) &&
           (((bVar6 = Compiler::is_builtin_variable((Compiler *)this,var), !bVar6 &&
             (bVar6 = Compiler::interface_variable_exists_in_entry_point
                                ((Compiler *)this,(var->super_IVariant).self.id), bVar6)) &&
            (bVar6 = Compiler::has_decoration
                               ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,
                                DecorationBlock), bVar6)))) {
          local_c8._M_dataplus._M_p._0_4_ = (pSVar9->super_IVariant).self.id;
          local_f0._M_dataplus._M_p = (pointer)&local_68;
          ::std::
          _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)1>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<spirv_cross::TypedID<(spirv_cross::Types)1>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)1>,true>>>>
                    ((_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)1>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_f0._M_dataplus._M_p,&local_c8,&local_f0);
        }
      }
      lVar14 = lVar14 + 4;
    } while (sVar3 << 2 != lVar14);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_110);
  ParsedIR::create_loop_hard_lock(local_a8);
  sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type.
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar3 != 0) {
    local_a8 = (ParsedIR *)CONCAT71(local_a8._1_7_,sVar3 == 0);
    local_88 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type.
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_98 = (ulong)local_cc;
    local_90 = sVar3 << 2;
    lVar14 = 0;
    bVar6 = false;
    do {
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>
             .ptr;
      pVVar5 = (Variant *)(&ts_1->_M_dataplus + (ulong)*(uint *)((long)&local_88->id + lVar14) * 3);
      TVar2 = pVVar5->type;
      bVar15 = true;
      if ((int)TVar2 < 9) {
        if (TVar2 == TypeType) {
          pSVar9 = Variant::get<spirv_cross::SPIRType>(pVVar5);
          bVar7 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,DecorationBlock);
          if (bVar7) {
            local_f0._M_dataplus._M_p._0_4_ = (pSVar9->super_IVariant).self.id;
            sVar12 = ::std::
                     _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::count((_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)&local_68,(key_type *)&local_f0);
            bVar7 = sVar12 == 0;
          }
          else {
            bVar7 = false;
          }
          bVar8 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,
                             DecorationBufferBlock);
          if (((pSVar9->basetype == Struct) &&
              ((pSVar9->array).super_VectorView<unsigned_int>.buffer_size == 0)) &&
             (!bVar8 && (!bVar7 && pSVar9->pointer == false))) {
            if (bVar6) {
              CompilerGLSL::statement<char_const(&)[1]>
                        (&this->super_CompilerGLSL,(char (*) [1])0x2b1c7b);
            }
            CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar9);
            bVar6 = false;
          }
        }
        else if (TVar2 == TypeConstant) {
          pSVar10 = Variant::get<spirv_cross::SPIRConstant>(pVVar5);
          if ((pSVar10->super_IVariant).self.id == local_cc) {
            pSVar10 = Variant::get<spirv_cross::SPIRConstant>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + local_98);
            CompilerGLSL::constant_expression_abi_cxx11_
                      (&local_f0,&this->super_CompilerGLSL,pSVar10,false,false);
            CompilerGLSL::statement<char_const(&)[39],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,
                       (char (*) [39])"static const uint3 gl_WorkGroupSize = ",&local_f0,
                       (char (*) [2])0x2d6cfb);
            goto LAB_001ab49a;
          }
          if (pSVar10->specialization == true) {
            pSVar9 = Variant::get<spirv_cross::SPIRType>
                               ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr +
                                *(uint *)&(pSVar10->super_IVariant).field_0xc);
            CompilerGLSL::add_resource_name
                      (&this->super_CompilerGLSL,(pSVar10->super_IVariant).self.id);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&local_f0,this,(ulong)(pSVar10->super_IVariant).self.id);
            bVar6 = Compiler::has_decoration
                              ((Compiler *)this,(ID)(pSVar10->super_IVariant).self.id,
                               DecorationSpecId);
            if (!bVar6) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                        (&local_110,this,pSVar9);
              CompilerGLSL::constant_expression_abi_cxx11_
                        (&local_c8,&this->super_CompilerGLSL,pSVar10,false,false);
              CompilerGLSL::
              statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                        (&this->super_CompilerGLSL,(char (*) [14])"static const ",&local_110,
                         (char (*) [4])0x2d6e67,&local_c8,(char (*) [2])0x2d6cfb);
              goto LAB_001ab472;
            }
            id = Compiler::get_decoration
                           ((Compiler *)this,(ID)(pSVar10->super_IVariant).self.id,DecorationSpecId)
            ;
            CompilerGLSL::constant_value_macro_name_abi_cxx11_
                      (&local_110,&this->super_CompilerGLSL,id);
            ts_1_00 = &pSVar10->specialization_constant_macro_name;
            ::std::__cxx11::string::operator=((string *)ts_1_00,(string *)&local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p);
            }
            CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&>
                      (&this->super_CompilerGLSL,(char (*) [9])"#ifndef ",ts_1_00);
            CompilerGLSL::constant_expression_abi_cxx11_
                      (&local_110,&this->super_CompilerGLSL,pSVar10,false,false);
            CompilerGLSL::
            statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string>
                      (&this->super_CompilerGLSL,(char (*) [9])"#define ",ts_1_00,
                       (char (*) [2])0x2be236,&local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p);
            }
            CompilerGLSL::statement<char_const(&)[7]>
                      (&this->super_CompilerGLSL,(char (*) [7])"#endif");
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                      (&local_110,this,pSVar9,&local_f0,0);
            CompilerGLSL::
            statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [14])"static const ",&local_110,
                       (char (*) [4])0x2d6e67,ts_1_00,(char (*) [2])0x2d6cfb);
            goto LAB_001ab486;
          }
        }
      }
      else if (TVar2 == TypeConstantOp) {
        pSVar13 = Variant::get<spirv_cross::SPIRConstantOp>(pVVar5);
        pSVar9 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr + (pSVar13->basetype).id);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(pSVar13->super_IVariant).self.id)
        ;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_f0,this,(ulong)(pSVar13->super_IVariant).self.id,1);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                  (&local_110,this,pSVar9,&local_f0,0);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x18])(&local_c8,this,pSVar13);
        CompilerGLSL::
        statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [14])"static const ",&local_110,
                   (char (*) [4])0x2d6e67,&local_c8,(char (*) [2])0x2d6cfb);
LAB_001ab472:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,(uint32_t)local_c8._M_dataplus._M_p) !=
            &local_c8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_c8._M_dataplus._M_p._4_4_,
                                   (uint32_t)local_c8._M_dataplus._M_p));
        }
LAB_001ab486:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
LAB_001ab49a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        bVar15 = true;
LAB_001ab4b1:
        bVar6 = true;
      }
      else if (TVar2 == TypeUndef) {
        pSVar11 = Variant::get<spirv_cross::SPIRUndef>(pVVar5);
        pSVar9 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(pSVar11->super_IVariant).field_0xc);
        bVar15 = pSVar9->basetype != Void;
        if (bVar15) {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          local_f0._M_string_length = 0;
          local_f0.field_2._M_local_buf[0] = '\0';
          if (((this->super_CompilerGLSL).options.force_zero_initialized_variables == true) &&
             (bVar6 = CompilerGLSL::type_can_zero_initialize(&this->super_CompilerGLSL,pSVar9),
             bVar6)) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3b])
                      (&local_c8,this,(ulong)*(uint *)&(pSVar11->super_IVariant).field_0xc);
            join<char_const(&)[4],std::__cxx11::string>
                      (&local_110,(spirv_cross *)0x2d6e67,(char (*) [4])&local_c8,ts_1);
            ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,(uint32_t)local_c8._M_dataplus._M_p) !=
                &local_c8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_c8._M_dataplus._M_p._4_4_,
                                       (uint32_t)local_c8._M_dataplus._M_p));
            }
          }
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&local_c8,this,(ulong)(pSVar11->super_IVariant).self.id,1);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                    (&local_110,this,pSVar9,&local_c8,(ulong)(pSVar11->super_IVariant).self.id);
          CompilerGLSL::
          statement<char_const(&)[8],std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [8])"static ",&local_110,&local_f0,
                     (char (*) [2])0x2d6cfb);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,(uint32_t)local_c8._M_dataplus._M_p) !=
              &local_c8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_c8._M_dataplus._M_p._4_4_,
                                     (uint32_t)local_c8._M_dataplus._M_p));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          goto LAB_001ab4b1;
        }
      }
      if (!bVar15) break;
      lVar14 = lVar14 + 4;
      local_a8 = (ParsedIR *)CONCAT71(local_a8._1_7_,local_90 == lVar14);
    } while (local_90 != lVar14);
    if (((byte)local_a8 & bVar6) != 0) {
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2b1c7b);
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_a0);
  ::std::
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&local_68);
  return;
}

Assistant:

void CompilerHLSL::emit_specialization_constants_and_structs()
{
	bool emitted = false;
	SpecializationConstant wg_x, wg_y, wg_z;
	ID workgroup_size_id = get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

	std::unordered_set<TypeID> io_block_types;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if ((var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
		    !var.remapped_variable && type.pointer && !is_builtin_variable(var) &&
		    interface_variable_exists_in_entry_point(var.self) &&
		    has_decoration(type.self, DecorationBlock))
		{
			io_block_types.insert(type.self);
		}
	});

	auto loop_lock = ir.create_loop_hard_lock();
	for (auto &id_ : ir.ids_for_constant_undef_or_type)
	{
		auto &id = ir.ids[id_];

		if (id.get_type() == TypeConstant)
		{
			auto &c = id.get<SPIRConstant>();

			if (c.self == workgroup_size_id)
			{
				statement("static const uint3 gl_WorkGroupSize = ",
				          constant_expression(get<SPIRConstant>(workgroup_size_id)), ";");
				emitted = true;
			}
			else if (c.specialization)
			{
				auto &type = get<SPIRType>(c.constant_type);
				add_resource_name(c.self);
				auto name = to_name(c.self);

				if (has_decoration(c.self, DecorationSpecId))
				{
					// HLSL does not support specialization constants, so fallback to macros.
					c.specialization_constant_macro_name =
							constant_value_macro_name(get_decoration(c.self, DecorationSpecId));

					statement("#ifndef ", c.specialization_constant_macro_name);
					statement("#define ", c.specialization_constant_macro_name, " ", constant_expression(c));
					statement("#endif");
					statement("static const ", variable_decl(type, name), " = ", c.specialization_constant_macro_name, ";");
				}
				else
					statement("static const ", variable_decl(type, name), " = ", constant_expression(c), ";");

				emitted = true;
			}
		}
		else if (id.get_type() == TypeConstantOp)
		{
			auto &c = id.get<SPIRConstantOp>();
			auto &type = get<SPIRType>(c.basetype);
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement("static const ", variable_decl(type, name), " = ", constant_op_expression(c), ";");
			emitted = true;
		}
		else if (id.get_type() == TypeType)
		{
			auto &type = id.get<SPIRType>();
			bool is_non_io_block = has_decoration(type.self, DecorationBlock) &&
			                       io_block_types.count(type.self) == 0;
			bool is_buffer_block = has_decoration(type.self, DecorationBufferBlock);
			if (type.basetype == SPIRType::Struct && type.array.empty() &&
			    !type.pointer && !is_non_io_block && !is_buffer_block)
			{
				if (emitted)
					statement("");
				emitted = false;

				emit_struct(type);
			}
		}
		else if (id.get_type() == TypeUndef)
		{
			auto &undef = id.get<SPIRUndef>();
			auto &type = this->get<SPIRType>(undef.basetype);
			// OpUndef can be void for some reason ...
			if (type.basetype == SPIRType::Void)
				return;

			string initializer;
			if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
				initializer = join(" = ", to_zero_initialized_expression(undef.basetype));

			statement("static ", variable_decl(type, to_name(undef.self), undef.self), initializer, ";");
			emitted = true;
		}
	}

	if (emitted)
		statement("");
}